

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

int Fl_Text_Editor::kf_select_all(int param_1,Fl_Text_Editor *e)

{
  uint uVar1;
  Fl_Text_Buffer *pFVar2;
  Fl_Text_Buffer *this;
  EVP_PKEY_CTX *dst;
  size_t sVar3;
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  char *copy;
  Fl_Text_Editor *e_local;
  int param_0_local;
  
  pFVar2 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
  this = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
  uVar1 = Fl_Text_Buffer::length(this);
  Fl_Text_Buffer::select(pFVar2,0,(fd_set *)(ulong)uVar1,in_RCX,in_R8,in_R9);
  pFVar2 = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
  dst = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(pFVar2);
  if (*dst != (EVP_PKEY_CTX)0x0) {
    sVar3 = strlen((char *)dst);
    Fl::copy(dst,(EVP_PKEY_CTX *)(sVar3 & 0xffffffff));
  }
  free(dst);
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_select_all(int, Fl_Text_Editor* e) {
  e->buffer()->select(0, e->buffer()->length());
  const char *copy = e->buffer()->selection_text();
  if (*copy) Fl::copy(copy, (int) strlen(copy), 0);
  free((void*)copy);
  return 1;
}